

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::RemoveCollisionModelsFromSystem(ChBody *this)

{
  int iVar1;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((this->super_ChPhysicsItem).system != (ChSystem *)0x0) {
    iVar1 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])();
    if ((char)iVar1 != '\0') {
      std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_20,
                   &(((this->super_ChPhysicsItem).system)->collision_system).
                    super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_20._M_ptr)->_vptr_ChCollisionSystem[5])
                (local_20._M_ptr,
                 (this->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    }
    return;
  }
  __assert_fail("this->GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBody.cpp"
                ,0x323,"virtual void chrono::ChBody::RemoveCollisionModelsFromSystem()");
}

Assistant:

void ChBody::RemoveCollisionModelsFromSystem() {
    assert(this->GetSystem());
    if (this->GetCollide())
        this->GetSystem()->GetCollisionSystem()->Remove(collision_model.get());
}